

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporarydir.cpp
# Opt level: O2

QString * defaultTemplateName(void)

{
  QString *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView other;
  QArrayDataPointer<char16_t> local_e8;
  QArrayDataPointer<char16_t> local_c8;
  QStringBuilder<QString,_char16_t> local_a8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&> local_80;
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>,_QLatin1String>
  local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8.d = (Data *)0x0;
  local_c8.ptr = (char16_t *)0x0;
  local_c8.size = 0;
  QCoreApplication::applicationName();
  local_c8.ptr = local_58.a.a.a.d.ptr;
  local_c8.d = local_58.a.a.a.d.d;
  local_58.a.a.a.d.d = (Data *)0x0;
  local_58.a.a.a.d.ptr = (char16_t *)0x0;
  local_c8.size = local_58.a.a.a.d.size;
  local_58.a.a.a.d.size = 0;
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  if (local_c8.size == 0) {
    other.m_data = "qt_temp";
    other.m_size = 7;
    QString::operator=((QString *)&local_c8,other);
  }
  QDir::tempPath();
  local_a8.a.d.size = local_e8.size;
  local_a8.a.d.ptr = local_e8.ptr;
  local_a8.a.d.d = local_e8.d;
  local_e8.d = (Data *)0x0;
  local_e8.ptr = (char16_t *)0x0;
  local_e8.size = 0;
  local_a8.b = L'/';
  QStringBuilder<QString,_char16_t>::QStringBuilder(&local_80.a,&local_a8);
  local_80.b = (QString *)&local_c8;
  QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>::QStringBuilder
            (&local_58.a,&local_80);
  local_58.b.m_size = 7;
  local_58.b.m_data = "-XXXXXX";
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_char16_t>,_QString_&>,_QLatin1String>::
  convertTo<QString>(in_RDI,&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_a8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_e8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static QString defaultTemplateName()
{
    QString baseName;
#if defined(QT_BUILD_CORE_LIB)
    baseName = QCoreApplication::applicationName();
    if (baseName.isEmpty())
#endif
        baseName = "qt_temp"_L1;

    return QDir::tempPath() + u'/' + baseName + "-XXXXXX"_L1;
}